

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tet_dvol_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *vol,REF_DBL *d_vol)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL det;
  REF_DBL m13;
  REF_DBL m12;
  REF_DBL m11;
  REF_DBL *d;
  REF_DBL *c;
  REF_DBL *b;
  REF_DBL *a;
  REF_DBL *d_vol_local;
  REF_DBL *vol_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if (((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
      ((((nodes[1] < 0 || (ref_node->max <= nodes[1])) ||
        ((ref_node->global[nodes[1]] < 0 || ((nodes[2] < 0 || (ref_node->max <= nodes[2])))))) ||
       (ref_node->global[nodes[2]] < 0)))) ||
     (((nodes[3] < 0 || (ref_node->max <= nodes[3])) || (ref_node->global[nodes[3]] < 0)))) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x9f6,
           "ref_node_tet_dvol_dnode0",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    pdVar1 = ref_node->real + *nodes * 0xf;
    pdVar2 = ref_node->real + nodes[1] * 0xf;
    pdVar3 = ref_node->real + nodes[2] * 0xf;
    pdVar4 = ref_node->real + nodes[3] * 0xf;
    *vol = -(((*pdVar1 - *pdVar4) *
              ((pdVar2[1] - pdVar4[1]) * (pdVar3[2] - pdVar4[2]) +
              -((pdVar3[1] - pdVar4[1]) * (pdVar2[2] - pdVar4[2]))) -
             (pdVar1[1] - pdVar4[1]) *
             ((*pdVar2 - *pdVar4) * (pdVar3[2] - pdVar4[2]) +
             -((*pdVar3 - *pdVar4) * (pdVar2[2] - pdVar4[2])))) +
            (pdVar1[2] - pdVar4[2]) *
            ((*pdVar2 - *pdVar4) * (pdVar3[1] - pdVar4[1]) +
            -((*pdVar3 - *pdVar4) * (pdVar2[1] - pdVar4[1])))) / 6.0;
    *d_vol = -((pdVar2[1] - pdVar4[1]) * (pdVar3[2] - pdVar4[2]) +
              -((pdVar3[1] - pdVar4[1]) * (pdVar2[2] - pdVar4[2]))) / 6.0;
    d_vol[1] = ((*pdVar2 - *pdVar4) * (pdVar3[2] - pdVar4[2]) +
               -((*pdVar3 - *pdVar4) * (pdVar2[2] - pdVar4[2]))) / 6.0;
    d_vol[2] = -((*pdVar2 - *pdVar4) * (pdVar3[1] - pdVar4[1]) +
                -((*pdVar3 - *pdVar4) * (pdVar2[1] - pdVar4[1]))) / 6.0;
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_dvol_dnode0(REF_NODE ref_node, REF_INT *nodes,
                                            REF_DBL *vol, REF_DBL *d_vol) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL det;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]) ||
      !ref_node_valid(ref_node, nodes[3]))
    RSS(REF_INVALID, "node invalid");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = ref_node_xyz_ptr(ref_node, nodes[3]);

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  det = (m11 - m12 + m13);

  *vol = -det / 6.0;
  d_vol[0] =
      -((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2])) / 6.0;
  d_vol[1] =
      ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2])) / 6.0;
  d_vol[2] =
      -((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1])) / 6.0;

  return REF_SUCCESS;
}